

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pre-process.c
# Opt level: O0

int preprocessor_if(dmr_C *C,stream *stream,token *token,int true_value)

{
  uint uVar1;
  int true_value_local;
  token *token_local;
  stream *stream_local;
  dmr_C *C_local;
  
  uVar1 = 0x1b;
  if (C->false_nesting != 0) {
    uVar1 = 0x1c;
  }
  token->pos = (position)((ulong)token->pos & 0xffffffffffffffc0 | (ulong)uVar1);
  free_preprocessor_line(C,token->next);
  token->next = stream->top_if;
  stream->top_if = token;
  if ((C->false_nesting != 0) || (true_value != 1)) {
    C->false_nesting = C->false_nesting + 1;
  }
  return 0;
}

Assistant:

static int preprocessor_if(struct dmr_C *C, struct stream *stream, struct token *token, int true_value)
{
	dmrC_token_type(token) = C->false_nesting ? TOKEN_SKIP_GROUPS : TOKEN_IF;
	free_preprocessor_line(C, token->next);
	token->next = stream->top_if;
	stream->top_if = token;
	if (C->false_nesting || true_value != 1)
		C->false_nesting++;
	return 0;
}